

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

ParseResult * __thiscall
cxxopts::OptionParser::parse
          (ParseResult *__return_storage_ptr__,OptionParser *this,int argc,char **argv)

{
  char __c;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
  *this_00;
  undefined8 uVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  char *pcVar7;
  pointer pvVar8;
  long lVar9;
  Value *pVVar10;
  ulong uVar11;
  ulong uVar12;
  element_type *peVar13;
  size_t sVar14;
  vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> local_2a0;
  vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> local_288;
  undefined1 local_26a;
  allocator<char> local_269;
  string local_268;
  size_t local_248;
  OptionValue *local_240;
  mapped_type *store;
  Value *value_1;
  shared_ptr<cxxopts::OptionDetails> *detail;
  value_type *opt_1;
  const_iterator __end1;
  const_iterator __begin1;
  OptionMap *__range1;
  shared_ptr<cxxopts::OptionDetails> opt;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
  local_1f0;
  const_iterator iter_1;
  string *name_1;
  string arg_value;
  undefined1 local_1a0 [8];
  shared_ptr<cxxopts::OptionDetails> value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
  local_148;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
  local_140;
  const_iterator iter;
  undefined1 local_130 [8];
  string name;
  size_t i;
  string *s;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  undefined1 local_a0 [8];
  ArguDesc argu_desc;
  undefined1 local_50 [7];
  bool matched;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unmatched;
  const_iterator next_positional;
  bool consume_remaining;
  int current;
  char **argv_local;
  int argc_local;
  OptionParser *this_local;
  ParseResult *parsed;
  
  next_positional._M_current._4_4_ = 1;
  next_positional._M_current._3_1_ = 0;
  unmatched.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin(this->m_positional);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_50);
  while (next_positional._M_current._4_4_ != argc) {
    iVar4 = strcmp(argv[next_positional._M_current._4_4_],"--");
    if (iVar4 == 0) {
      next_positional._M_current._3_1_ = 1;
      next_positional._M_current._4_4_ = next_positional._M_current._4_4_ + 1;
      break;
    }
    argu_desc.value.field_2._M_local_buf[0xf] = '\0';
    values::parser_tool::ParseArgument
              ((ArguDesc *)local_a0,argv[next_positional._M_current._4_4_],
               (bool *)(argu_desc.value.field_2._M_local_buf + 0xf));
    if ((argu_desc.value.field_2._M_local_buf[0xf] & 1U) == 0) {
      if (((*argv[next_positional._M_current._4_4_] == '-') &&
          (argv[next_positional._M_current._4_4_][1] != '\0')) &&
         ((this->m_allow_unrecognised & 1U) == 0)) {
        pcVar7 = argv[next_positional._M_current._4_4_];
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,pcVar7,&local_d1);
        throw_or_mimic<cxxopts::exceptions::invalid_option_syntax>(&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::allocator<char>::~allocator(&local_d1);
      }
      pcVar7 = argv[next_positional._M_current._4_4_];
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,pcVar7,(allocator<char> *)((long)&s + 7));
      bVar2 = consume_positional(this,&local_f8,
                                 (PositionalListIterator *)
                                 &unmatched.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)&local_f8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&s + 7));
      if (!bVar2) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*const&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_50,
                   argv + next_positional._M_current._4_4_);
      }
LAB_001424ec:
      value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ._0_4_ = 0;
    }
    else {
      if ((argu_desc.arg_name.field_2._M_local_buf[8] & 1U) != 0) {
        for (name.field_2._8_8_ = 0; uVar1 = name.field_2._8_8_,
            lVar6 = std::__cxx11::string::size(), uVar1 != lVar6;
            name.field_2._8_8_ = name.field_2._8_8_ + 1) {
          pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_a0);
          __c = *pcVar7;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_130,1,__c,
                     (allocator<char> *)
                     ((long)&iter.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                             ._M_cur + 7));
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&iter.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                             ._M_cur + 7));
          local_140._M_cur =
               (__node_type *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
               ::find(this->m_options,(key_type *)local_130);
          local_148._M_cur =
               (__node_type *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
               ::end(this->m_options);
          bVar2 = std::__detail::operator==(&local_140,&local_148);
          if (bVar2) {
            if ((this->m_allow_unrecognised & 1U) == 0) {
              throw_or_mimic<cxxopts::exceptions::no_such_option>((string *)local_130);
              goto LAB_001420dc;
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_188,"-",
                       (allocator<char> *)
                       ((long)&value.
                               super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi + 7));
            pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_a0);
            std::operator+(&local_168,&local_188,*pcVar7);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_50,&local_168);
            std::__cxx11::string::~string((string *)&local_168);
            std::__cxx11::string::~string((string *)&local_188);
            std::allocator<char>::~allocator
                      ((allocator<char> *)
                       ((long)&value.
                               super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi + 7));
            value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi._0_4_ = 6;
          }
          else {
LAB_001420dc:
            pvVar8 = std::__detail::
                     _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_false,_true>
                     ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_false,_true>
                                   *)&local_140);
            std::shared_ptr<cxxopts::OptionDetails>::shared_ptr
                      ((shared_ptr<cxxopts::OptionDetails> *)local_1a0,&pvVar8->second);
            lVar6 = name.field_2._8_8_ + 1;
            lVar9 = std::__cxx11::string::size();
            if (lVar6 == lVar9) {
              checked_parse_arg(this,argc,argv,(int *)((long)&next_positional._M_current + 4),
                                (shared_ptr<cxxopts::OptionDetails> *)local_1a0,(string *)local_130)
              ;
LAB_00142302:
              value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi._0_4_ = 0;
            }
            else {
              peVar13 = std::
                        __shared_ptr_access<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)local_1a0);
              pVVar10 = OptionDetails::value(peVar13);
              uVar5 = (*pVVar10->_vptr_Value[7])();
              if ((uVar5 & 1) != 0) {
                peVar13 = std::
                          __shared_ptr_access<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)local_1a0);
                pVVar10 = OptionDetails::value(peVar13);
                (*pVVar10->_vptr_Value[9])((undefined1 *)((long)&arg_value.field_2 + 8));
                parse_option(this,(shared_ptr<cxxopts::OptionDetails> *)local_1a0,
                             (string *)local_130,(string *)((long)&arg_value.field_2 + 8));
                std::__cxx11::string::~string((string *)(arg_value.field_2._M_local_buf + 8));
                goto LAB_00142302;
              }
              uVar11 = name.field_2._8_8_ + 1;
              uVar12 = std::__cxx11::string::size();
              if (uVar12 <= uVar11) {
                throw_or_mimic<cxxopts::exceptions::option_requires_argument>((string *)local_130);
                goto LAB_00142302;
              }
              std::__cxx11::string::substr((ulong)&name_1,(ulong)local_a0);
              parse_option(this,(shared_ptr<cxxopts::OptionDetails> *)local_1a0,(string *)local_130,
                           (string *)&name_1);
              value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi._0_4_ = 4;
              std::__cxx11::string::~string((string *)&name_1);
            }
            std::shared_ptr<cxxopts::OptionDetails>::~shared_ptr
                      ((shared_ptr<cxxopts::OptionDetails> *)local_1a0);
          }
          std::__cxx11::string::~string((string *)local_130);
          if (((int)value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != 0) &&
             ((int)value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi == 4)) break;
        }
        goto LAB_001424ec;
      }
      lVar6 = std::__cxx11::string::length();
      if (lVar6 == 0) goto LAB_001424ec;
      iter_1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
      ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                 )local_a0;
      local_1f0._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
           ::find(this->m_options,
                  (key_type *)
                  iter_1.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                  ._M_cur);
      opt.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
           ::end(this->m_options);
      bVar2 = std::__detail::operator==
                        (&local_1f0,
                         (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                          *)&opt.
                             super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
      if (!bVar2) {
LAB_0014244c:
        pvVar8 = std::__detail::
                 _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_false,_true>
                 ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_false,_true>
                               *)&local_1f0);
        std::shared_ptr<cxxopts::OptionDetails>::shared_ptr
                  ((shared_ptr<cxxopts::OptionDetails> *)&__range1,&pvVar8->second);
        if ((argu_desc.arg_name.field_2._M_local_buf[9] & 1U) == 0) {
          checked_parse_arg(this,argc,argv,(int *)((long)&next_positional._M_current + 4),
                            (shared_ptr<cxxopts::OptionDetails> *)&__range1,
                            (string *)
                            iter_1.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                            ._M_cur);
        }
        else {
          parse_option(this,(shared_ptr<cxxopts::OptionDetails> *)&__range1,
                       (string *)
                       iter_1.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                       ._M_cur,(string *)&argu_desc.grouping);
        }
        std::shared_ptr<cxxopts::OptionDetails>::~shared_ptr
                  ((shared_ptr<cxxopts::OptionDetails> *)&__range1);
        goto LAB_001424ec;
      }
      if ((this->m_allow_unrecognised & 1U) == 0) {
        throw_or_mimic<cxxopts::exceptions::no_such_option>
                  ((string *)
                   iter_1.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                   ._M_cur);
        goto LAB_0014244c;
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*const&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_50,
                 argv + next_positional._M_current._4_4_);
      value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ._0_4_ = 2;
    }
    next_positional._M_current._4_4_ = next_positional._M_current._4_4_ + 1;
    values::parser_tool::ArguDesc::~ArguDesc((ArguDesc *)local_a0);
  }
  this_00 = this->m_options;
  __end1 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
           ::begin(this_00);
  opt_1 = (value_type *)
          std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
          ::end(this_00);
  while (bVar2 = std::__detail::operator!=
                           (&__end1.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                            ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                              *)&opt_1), bVar2) {
    detail = (shared_ptr<cxxopts::OptionDetails> *)
             std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_false,_true>
             ::operator*(&__end1);
    value_1 = (Value *)&((reference)detail)->second;
    peVar13 = std::
              __shared_ptr_access<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)value_1);
    store = (mapped_type *)OptionDetails::value(peVar13);
    peVar13 = std::
              __shared_ptr_access<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)value_1);
    local_248 = OptionDetails::hash(peVar13);
    local_240 = std::
                unordered_map<unsigned_long,_cxxopts::OptionValue,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>_>
                ::operator[](&this->m_parsed,&local_248);
    bVar3 = (*(code *)store->m_long_names[1].
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage)();
    if ((bVar3 & 1) == 0) {
      parse_no_value(this,(shared_ptr<cxxopts::OptionDetails> *)value_1);
    }
    else {
      sVar14 = OptionValue::count(local_240);
      if ((sVar14 == 0) && (bVar2 = OptionValue::has_default(local_240), !bVar2)) {
        parse_default(this,(shared_ptr<cxxopts::OptionDetails> *)value_1);
      }
    }
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_false,_true>
    ::operator++(&__end1);
  }
  if ((next_positional._M_current._3_1_ & 1) != 0) {
    for (; next_positional._M_current._4_4_ < argc;
        next_positional._M_current._4_4_ = next_positional._M_current._4_4_ + 1) {
      pcVar7 = argv[next_positional._M_current._4_4_];
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,pcVar7,&local_269);
      bVar2 = consume_positional(this,&local_268,
                                 (PositionalListIterator *)
                                 &unmatched.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)&local_268);
      std::allocator<char>::~allocator(&local_269);
      if (((bVar2 ^ 0xffU) & 1) != 0) break;
    }
    for (; next_positional._M_current._4_4_ != argc;
        next_positional._M_current._4_4_ = next_positional._M_current._4_4_ + 1) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*const&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_50,
                 argv + next_positional._M_current._4_4_);
    }
  }
  finalise_aliases(this);
  local_26a = 0;
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::vector
            (&local_288,&this->m_sequential);
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::vector
            (&local_2a0,&this->m_defaults);
  ParseResult::ParseResult
            (__return_storage_ptr__,&this->m_keys,&this->m_parsed,&local_288,&local_2a0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_50);
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector(&local_2a0);
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector(&local_288);
  value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = 1;
  local_26a = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  return __return_storage_ptr__;
}

Assistant:

inline ParseResult
OptionParser::parse(int argc, const char* const* argv)
{
  int current = 1;
  bool consume_remaining = false;
  auto next_positional = m_positional.begin();

  std::vector<std::string> unmatched;

  while (current != argc)
  {
    if (strcmp(argv[current], "--") == 0)
    {
      consume_remaining = true;
      ++current;
      break;
    }
    bool matched = false;
    values::parser_tool::ArguDesc argu_desc =
        values::parser_tool::ParseArgument(argv[current], matched);

    if (!matched)
    {
      //not a flag

      // but if it starts with a `-`, then it's an error
      if (argv[current][0] == '-' && argv[current][1] != '\0') {
        if (!m_allow_unrecognised) {
          throw_or_mimic<exceptions::invalid_option_syntax>(argv[current]);
        }
      }

      //if true is returned here then it was consumed, otherwise it is
      //ignored
      if (consume_positional(argv[current], next_positional))
      {
      }
      else
      {
        unmatched.emplace_back(argv[current]);
      }
      //if we return from here then it was parsed successfully, so continue
    }
    else
    {
      //short or long option?
      if (argu_desc.grouping)
      {
        const std::string& s = argu_desc.arg_name;

        for (std::size_t i = 0; i != s.size(); ++i)
        {
          std::string name(1, s[i]);
          auto iter = m_options.find(name);

          if (iter == m_options.end())
          {
            if (m_allow_unrecognised)
            {
              unmatched.push_back(std::string("-") + s[i]);
              continue;
            }
            //error
            throw_or_mimic<exceptions::no_such_option>(name);
          }

          auto value = iter->second;

          if (i + 1 == s.size())
          {
            //it must be the last argument
            checked_parse_arg(argc, argv, current, value, name);
          }
          else if (value->value().has_implicit())
          {
            parse_option(value, name, value->value().get_implicit_value());
          }
          else if (i + 1 < s.size())
          {
            std::string arg_value = s.substr(i + 1);
            parse_option(value, name, arg_value);
            break;
          }
          else
          {
            //error
            throw_or_mimic<exceptions::option_requires_argument>(name);
          }
        }
      }
      else if (argu_desc.arg_name.length() != 0)
      {
        const std::string& name = argu_desc.arg_name;

        auto iter = m_options.find(name);

        if (iter == m_options.end())
        {
          if (m_allow_unrecognised)
          {
            // keep unrecognised options in argument list, skip to next argument
            unmatched.emplace_back(argv[current]);
            ++current;
            continue;
          }
          //error
          throw_or_mimic<exceptions::no_such_option>(name);
        }

        auto opt = iter->second;

        //equals provided for long option?
        if (argu_desc.set_value)
        {
          //parse the option given

          parse_option(opt, name, argu_desc.value);
        }
        else
        {
          //parse the next argument
          checked_parse_arg(argc, argv, current, opt, name);
        }
      }

    }

    ++current;
  }

  for (auto& opt : m_options)
  {
    auto& detail = opt.second;
    const auto& value = detail->value();

    auto& store = m_parsed[detail->hash()];

    if (value.has_default()) {
      if (!store.count() && !store.has_default()) {
        parse_default(detail);
      }
    }
    else {
      parse_no_value(detail);
    }
  }

  if (consume_remaining)
  {
    while (current < argc)
    {
      if (!consume_positional(argv[current], next_positional)) {
        break;
      }
      ++current;
    }

    //adjust argv for any that couldn't be swallowed
    while (current != argc) {
      unmatched.emplace_back(argv[current]);
      ++current;
    }
  }

  finalise_aliases();

  ParseResult parsed(std::move(m_keys), std::move(m_parsed), std::move(m_sequential), std::move(m_defaults), std::move(unmatched));
  return parsed;
}